

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_inter.c
# Opt level: O2

void sys_bail(int n)

{
  if (sys_bail_reentered != '\0') {
    _exit(1);
  }
  sys_bail_reentered = 1;
  exit(n);
}

Assistant:

void sys_bail(int n)
{
    static int reentered = 0;
    if (!reentered)
    {
        reentered = 1;
#if !defined(__linux__) && !defined(__FreeBSD_kernel__) && !defined(__GNU__)
            /* sys_close_audio() hangs if you're in a signal? */
        fprintf(stderr ,"gui socket %d - \n", INTER->i_guisock);
        fprintf(stderr, "closing audio...\n");
        sys_close_audio();
        fprintf(stderr, "closing MIDI...\n");
        sys_close_midi();
        fprintf(stderr, "... done.\n");
#endif
        exit(n);
    }
    else _exit(1);
}